

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O1

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  long *plVar1;
  Name *pNVar2;
  __pointer_type pMVar3;
  undefined8 *puVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  pointer ppEVar7;
  iterator __position;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  size_t sVar15;
  Try *this_00;
  iterator iVar16;
  bool bVar17;
  Index IVar18;
  Id IVar19;
  int iVar20;
  uintptr_t *puVar21;
  __node_base_ptr p_Var22;
  Try *pTVar23;
  _Hash_node_base *p_Var24;
  LocalSet *pLVar25;
  Expression *pEVar26;
  Expression **ppEVar27;
  mapped_type *pmVar28;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_01;
  long lVar29;
  _Rb_tree_node_base *p_Var30;
  undefined4 extraout_var;
  Type TVar31;
  Expression *expr;
  uint uVar32;
  Name *pNVar33;
  uintptr_t *puVar34;
  Type type_00;
  long *plVar35;
  long *plVar36;
  ExpressionList *pEVar37;
  ulong uVar38;
  ulong uVar39;
  Type type;
  undefined8 *puVar40;
  Builder BVar41;
  MixedArena *expression;
  byte unaff_R15B;
  uintptr_t uVar42;
  Iterator __first;
  Iterator __last;
  undefined1 auStack_a8 [8];
  ExpressionList newList;
  Try *local_78;
  Expression *curr_local;
  Expression *prelude_1;
  iterator iStack_60;
  pointer local_58;
  ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  *local_50;
  Builder local_48;
  Builder builder;
  
  prelude_1 = (Expression *)0x0;
  iStack_60._M_current = (Expression **)0x0;
  local_58 = (pointer)0x0;
  local_48.wasm =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
       .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.currModule;
  local_78 = (Try *)curr;
  builder.wasm = (Module *)this;
  bVar17 = Properties::isSingleConstantExpression(curr);
  if (bVar17) goto LAB_006f7dc7;
  IVar19 = curr->_id;
  if (IVar19 == TupleMakeId) {
    uVar42 = curr[1].type.id;
    unaff_R15B = uVar42 == 0;
    if (!(bool)unaff_R15B) {
      uVar38 = 0;
      do {
        if (curr[1].type.id <= uVar38) goto LAB_006f826a;
        bVar17 = Properties::isSingleConstantExpression
                           (*(Expression **)(*(long *)(curr + 1) + uVar38 * 8));
        if (!bVar17) break;
        uVar38 = uVar38 + 1;
        unaff_R15B = uVar42 == uVar38;
      } while (!(bool)unaff_R15B);
    }
  }
  BVar41.wasm = builder.wasm;
  this_00 = local_78;
  if ((IVar19 == TupleMakeId & unaff_R15B) != 0) goto LAB_006f7dc7;
  local_50 = (ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
              *)&(builder.wasm)->globals;
  IVar19 = (local_78->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression._id;
  if (IVar19 - BlockId < 3) {
LAB_006f74e5:
    type_00.id = (uintptr_t)((builder.wasm)->allocator).next._M_b._M_p;
    plVar35 = *(long **)(((builder.wasm)->allocator).threadId._M_thread +
                        ((ulong)local_78 % type_00.id) * 8);
    plVar36 = (long *)0x0;
    if ((plVar35 != (long *)0x0) &&
       (plVar1 = (long *)*plVar35, plVar36 = plVar35, local_78 != (Try *)((long *)*plVar35)[1])) {
      while (plVar35 = plVar1, plVar1 = (long *)*plVar35, plVar1 != (long *)0x0) {
        plVar36 = (long *)0x0;
        if (((ulong)plVar1[1] % type_00.id != (ulong)local_78 % type_00.id) ||
           (plVar36 = plVar35, local_78 == (Try *)plVar1[1])) goto LAB_006f75c1;
      }
      plVar36 = (long *)0x0;
    }
LAB_006f75c1:
    if ((plVar36 != (long *)0x0) && (*plVar36 != 0)) {
      __assert_fail("preludes.find(curr) == preludes.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                    ,0x68,"void wasm::Flatten::visitExpression(Expression *)");
    }
    if (IVar19 == BlockId) {
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements =
           (size_t)(&((builder.wasm)->debugInfoFileNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[10].field_2.
                     _M_allocated_capacity + 1);
      auStack_a8 = (undefined1  [8])0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
           (Expression **)0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      pNVar2 = (local_78->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
      ;
      if (pNVar2 != (Name *)0x0) {
        pNVar33 = (Name *)0x0;
        do {
          if ((this_00->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
              <= pNVar33) {
LAB_006f826a:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          pEVar26 = *(Expression **)(&this_00->body->_id + (long)pNVar33 * 2);
          pMVar3 = ((BVar41.wasm)->allocator).next._M_b._M_p;
          uVar38 = (ulong)pEVar26 % (ulong)pMVar3;
          puVar34 = *(uintptr_t **)(((BVar41.wasm)->allocator).threadId._M_thread + uVar38 * 8);
          puVar21 = (uintptr_t *)0x0;
          if ((puVar34 != (uintptr_t *)0x0) &&
             (type_00.id = *puVar34, puVar21 = puVar34, puVar34 = (uintptr_t *)type_00.id,
             pEVar26 != *(Expression **)(type_00.id + 8))) {
            while (type_00.id = *puVar34, (uintptr_t *)type_00.id != (uintptr_t *)0x0) {
              puVar21 = (uintptr_t *)0x0;
              if (((ulong)*(Expression **)(type_00.id + 8) % (ulong)pMVar3 != uVar38) ||
                 (puVar21 = puVar34, puVar34 = (uintptr_t *)type_00.id,
                 pEVar26 == *(Expression **)(type_00.id + 8))) goto LAB_006f768c;
            }
            puVar21 = (uintptr_t *)0x0;
          }
LAB_006f768c:
          if (puVar21 == (uintptr_t *)0x0) {
            uVar42 = 0;
          }
          else {
            uVar42 = *puVar21;
          }
          if (uVar42 != 0) {
            puVar4 = *(undefined8 **)(uVar42 + 0x18);
            for (puVar40 = *(undefined8 **)(uVar42 + 0x10); puVar40 != puVar4; puVar40 = puVar40 + 1
                ) {
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         auStack_a8,(Expression *)*puVar40);
            }
            BVar41.wasm = builder.wasm;
            if (*(long *)(uVar42 + 0x18) != *(long *)(uVar42 + 0x10)) {
              *(long *)(uVar42 + 0x18) = *(long *)(uVar42 + 0x10);
            }
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     auStack_a8,pEVar26);
          pNVar33 = (Name *)((long)&(pNVar33->super_IString).str._M_len + 1);
        } while (pNVar33 != pNVar2);
      }
      this_00->body = (Expression *)auStack_a8;
      (this_00->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
           (Name *)newList.
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      (this_00->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements =
           newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
           usedElements;
      auStack_a8 = (undefined1  [8])0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
           (Expression **)0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      uVar38 = (this_00->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.
               id;
      if (1 < uVar38) {
        type_00.id = (uintptr_t)(this_00->name).super_IString.str._M_str;
        p_Var22 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&((BVar41.wasm)->exportsMap)._M_h._M_rehash_policy._M_next_resize,
                             type_00.id % (ulong)((BVar41.wasm)->exportsMap)._M_h._M_single_bucket,
                             &this_00->name,type_00.id);
        if (p_Var22 == (__node_base_ptr)0x0) {
          p_Var24 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var24 = p_Var22->_M_nxt;
        }
        if (p_Var24 == (_Hash_node_base *)0x0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar38;
          IVar19 = Builder::addVar((Builder *)
                                   ((builder.wasm)->debugInfoFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                   (Name)(auVar11 << 0x40),type_00);
        }
        else {
          IVar19 = *(Id *)&p_Var24[3]._M_nxt;
        }
        pNVar2 = (this_00->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                 data;
        if (pNVar2 == (Name *)0x0) {
          __assert_fail("usedElements > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xd0,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar26 = this_00->body;
        pEVar6 = *(Expression **)((long)pEVar26 + (long)pNVar2 * 8 + -8);
        if (1 < (pEVar6->type).id) {
          pLVar25 = Builder::makeLocalSet(&local_48,IVar19,pEVar6);
          *(LocalSet **)((long)pEVar26 + (long)pNVar2 * 8 + -8) = pLVar25;
        }
        Block::finalize((Block *)this_00,(Type)0x0);
        pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        pEVar26->_id = LocalGetId;
        pEVar26[1]._id = IVar19;
        (pEVar26->type).id = uVar38;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,pEVar26);
        ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                             ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features);
        *ppEVar27 = pEVar26;
        curr_local = (Expression *)this_00;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   &curr_local);
      }
      Block::finalize((Block *)this_00,(Type)0x0);
    }
    else {
      if (local_78 == (Try *)0x0 || IVar19 != IfId) {
        if (local_78 == (Try *)0x0 || IVar19 != LoopId) {
          if ((local_78 == (Try *)0x0) || (IVar19 != TryId)) {
            handle_unreachable("unexpected expr type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                               ,0xe5);
          }
          pEVar26 = local_78->body;
          pEVar37 = &local_78->catchBodies;
          type_00.id = (local_78->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements;
          __first.index = 0;
          __first.parent = pEVar37;
          __last.index = type_00.id;
          __last.parent = pEVar37;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_a8,
                     __first,__last,(allocator_type *)&curr_local);
          uVar38 = (this_00->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.
                   type.id;
          pTVar23 = this_00;
          if (1 < uVar38) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar38;
            IVar18 = Builder::addVar((Builder *)
                                     ((BVar41.wasm)->debugInfoFileNames).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                     (Name)(auVar8 << 0x40),type_00);
            if (1 < (this_00->body->type).id) {
              pLVar25 = Builder::makeLocalSet(&local_48,IVar18,this_00->body);
              this_00->body = (Expression *)pLVar25;
            }
            if ((this_00->catchBodies).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements != 0) {
              uVar32 = 1;
              uVar39 = 0;
              do {
                pEVar6 = (pEVar37->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                         .data[uVar39];
                if (1 < (pEVar6->type).id) {
                  pLVar25 = Builder::makeLocalSet(&local_48,IVar18,pEVar6);
                  if ((this_00->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      usedElements <= uVar39) goto LAB_006f826a;
                  (pEVar37->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                  [uVar39] = (Expression *)pLVar25;
                }
                uVar39 = (ulong)uVar32;
                uVar32 = uVar32 + 1;
              } while (uVar39 < (this_00->catchBodies).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                .usedElements);
            }
            pTVar23 = (Try *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
            (pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression._id =
                 LocalGetId;
            *(Index *)&(pTVar23->name).super_IString.str._M_len = IVar18;
            (pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id =
                 uVar38;
            curr_local = (Expression *)this_00;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       &curr_local);
            BVar41 = builder;
          }
          pEVar26 = getPreludesWithExpression((Flatten *)BVar41.wasm,pEVar26,this_00->body);
          this_00->body = pEVar26;
          if ((this_00->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements != 0) {
            uVar32 = 1;
            uVar38 = 0;
            do {
              pEVar26 = getPreludesWithExpression
                                  ((Flatten *)builder.wasm,
                                   *(Expression **)
                                    (&(((SpecificExpression<(wasm::Expression::Id)9> *)auStack_a8)->
                                      super_Expression)._id + uVar38 * 2),
                                   (pEVar37->
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ).data[uVar38]);
              if ((this_00->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements <= uVar38) goto LAB_006f826a;
              (this_00->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
              [uVar38] = pEVar26;
              uVar38 = (ulong)uVar32;
              uVar32 = uVar32 + 1;
            } while (uVar38 < (this_00->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements);
          }
          Try::finalize(this_00);
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)local_50,(Expression *)pTVar23);
          ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                               ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features);
          *ppEVar27 = (Expression *)pTVar23;
          if (auStack_a8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_a8,
                            newList.
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements - (long)auStack_a8);
          }
          goto LAB_006f7c40;
        }
        uVar38 = (local_78->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.
                 type.id;
        pEVar26 = local_78->body;
        pTVar23 = local_78;
        if (1 < uVar38) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar38;
          IVar18 = Builder::addVar((Builder *)
                                   ((builder.wasm)->debugInfoFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                   (Name)(auVar10 << 0x40),type_00);
          pLVar25 = Builder::makeLocalSet(&local_48,IVar18,this_00->body);
          this_00->body = (Expression *)pLVar25;
          pTVar23 = (Try *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id =
               LocalGetId;
          *(Index *)&(pTVar23->name).super_IString.str._M_len = IVar18;
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id
               = uVar38;
          auStack_a8 = (undefined1  [8])this_00;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                     (Expression **)auStack_a8);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id = 0
          ;
        }
        BVar41.wasm = builder.wasm;
        pEVar26 = getPreludesWithExpression((Flatten *)builder.wasm,pEVar26,this_00->body);
        this_00->body = pEVar26;
        Loop::finalize((Loop *)this_00);
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,(Expression *)pTVar23);
      }
      else {
        pTVar23 = (Try *)getPreludesWithExpression
                                   ((Flatten *)builder.wasm,
                                    (Expression *)(local_78->name).super_IString.str._M_len,
                                    (Expression *)local_78);
        uVar38 = (this_00->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type
                 .id;
        pEVar26 = (Expression *)(this_00->name).super_IString.str._M_str;
        pEVar6 = this_00->body;
        auStack_a8 = (undefined1  [8])0x0;
        if (1 < uVar38) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar38;
          IVar18 = Builder::addVar((Builder *)
                                   ((builder.wasm)->debugInfoFileNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                   (Name)(auVar9 << 0x40),type_00);
          pEVar5 = (Expression *)(this_00->name).super_IString.str._M_str;
          if (1 < (pEVar5->type).id) {
            pLVar25 = Builder::makeLocalSet(&local_48,IVar18,pEVar5);
            (this_00->name).super_IString.str._M_str = (char *)pLVar25;
          }
          pEVar5 = this_00->body;
          if ((pEVar5 != (Expression *)0x0) && (1 < (pEVar5->type).id)) {
            pLVar25 = Builder::makeLocalSet(&local_48,IVar18,pEVar5);
            this_00->body = (Expression *)pLVar25;
          }
          auStack_a8 = (undefined1  [8])pTVar23;
          pTVar23 = (Try *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression)._id =
               LocalGetId;
          *(Index *)&(pTVar23->name).super_IString.str._M_len = IVar18;
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)49>)->super_Expression).type.id
               = uVar38;
        }
        BVar41.wasm = builder.wasm;
        pEVar26 = getPreludesWithExpression
                            ((Flatten *)builder.wasm,pEVar26,
                             (Expression *)(this_00->name).super_IString.str._M_str);
        (this_00->name).super_IString.str._M_str = (char *)pEVar26;
        if (this_00->body != (Expression *)0x0) {
          pEVar26 = getPreludesWithExpression((Flatten *)BVar41.wasm,pEVar6,this_00->body);
          this_00->body = pEVar26;
        }
        If::finalize((If *)this_00);
        if (auStack_a8 != (undefined1  [8])0x0) {
          Visitor<wasm::ReFinalizeNode,_void>::visit
                    ((Visitor<wasm::ReFinalizeNode,_void> *)&curr_local,(Expression *)auStack_a8);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&prelude_1,
                     (value_type *)auStack_a8);
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,(Expression *)pTVar23);
      }
      ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                           ((SmallVector<wasm::Expression_*,_10UL> *)&(BVar41.wasm)->features);
      *ppEVar27 = (Expression *)pTVar23;
    }
  }
  else {
    if (IVar19 == NopId) goto LAB_006f7dc7;
    if (IVar19 == TryId) goto LAB_006f74e5;
    type_00.id = (uintptr_t)((builder.wasm)->allocator).next._M_b._M_p;
    plVar35 = *(long **)(((builder.wasm)->allocator).threadId._M_thread +
                        ((ulong)local_78 % type_00.id) * 8);
    plVar36 = (long *)0x0;
    if ((plVar35 != (long *)0x0) &&
       (plVar1 = (long *)*plVar35, plVar36 = plVar35, local_78 != (Try *)((long *)*plVar35)[1])) {
      while (plVar35 = plVar1, plVar1 = (long *)*plVar35, plVar1 != (long *)0x0) {
        plVar36 = (long *)0x0;
        if (((ulong)plVar1[1] % type_00.id != (ulong)local_78 % type_00.id) ||
           (plVar36 = plVar35, local_78 == (Try *)plVar1[1])) goto LAB_006f7e50;
      }
      plVar36 = (long *)0x0;
    }
LAB_006f7e50:
    if (plVar36 == (long *)0x0) {
      lVar29 = 0;
    }
    else {
      lVar29 = *plVar36;
    }
    if (lVar29 != 0) {
      pEVar26 = *(Expression **)(lVar29 + 0x10);
      pEVar6 = *(Expression **)(lVar29 + 0x18);
      ppEVar7 = *(pointer *)(lVar29 + 0x20);
      *(Expression **)(lVar29 + 0x10) = prelude_1;
      *(Expression ***)(lVar29 + 0x18) = iStack_60._M_current;
      *(pointer *)(lVar29 + 0x20) = local_58;
      prelude_1 = pEVar26;
      iStack_60._M_current = (Expression **)pEVar6;
      local_58 = ppEVar7;
    }
    if (local_78 == (Try *)0x0 || IVar19 != LocalSetId) {
      if (local_78 == (Try *)0x0 || IVar19 != BreakId) {
        if ((local_78 != (Try *)0x0 && IVar19 == SwitchId) &&
           (expression = (local_78->catchTags).allocator, expression != (MixedArena *)0x0)) {
          TVar31.id = ((Type *)&(expression->chunks).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_finish)->id;
          if (TVar31.id < 2) {
            if (TVar31.id != 1) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                            ,0x146,"void wasm::Flatten::visitExpression(Expression *)");
            }
            Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
            replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)local_50,(Expression *)expression);
LAB_006f81e7:
            ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                                 ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features
                                 );
            *ppEVar27 = (Expression *)expression;
          }
          else {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = TVar31.id;
            IVar19 = Builder::addVar((Builder *)
                                     ((builder.wasm)->debugInfoFileNames).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                     (Name)(auVar13 << 0x40),type_00);
            auStack_a8 = (undefined1  [8])
                         Builder::makeLocalSet
                                   (&local_48,IVar19,(Expression *)(this_00->catchTags).allocator);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_a8);
            BranchUtils::getUniqueTargets((NameSet *)auStack_a8,(BranchUtils *)this_00,expr);
            for (p_Var30 = (_Rb_tree_node_base *)
                           newList.
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .allocatedElements; p_Var30 != (_Rb_tree_node_base *)&newList;
                p_Var30 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var30)) {
              IVar18 = getTempForBreakTarget
                                 ((Flatten *)builder.wasm,(Name)*(string_view *)(p_Var30 + 1),TVar31
                                 );
              pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
              pEVar26->_id = LocalGetId;
              pEVar26[1]._id = IVar19;
              (pEVar26->type).id = TVar31.id;
              curr_local = (Expression *)Builder::makeLocalSet(&local_48,IVar18,pEVar26);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                         &curr_local);
            }
            (this_00->catchTags).allocator = (MixedArena *)0x0;
            Switch::finalize((Switch *)this_00);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)auStack_a8);
          }
        }
      }
      else {
        expression = (MixedArena *)local_78->body;
        if (expression != (MixedArena *)0x0) {
          uVar38 = ((Type *)&(expression->chunks).
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish)->id;
          if (uVar38 < 2) {
            if (uVar38 != 1) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                            ,0x12f,"void wasm::Flatten::visitExpression(Expression *)");
            }
            Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
            replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)local_50,(Expression *)expression);
            goto LAB_006f81e7;
          }
          pEVar26 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    ::findBreakTarget(local_50,(Name)(local_78->name).super_IString.str);
          TVar31.id = (pEVar26->type).id;
          IVar19 = getTempForBreakTarget
                             ((Flatten *)builder.wasm,(Name)(this_00->name).super_IString.str,TVar31
                             );
          auStack_a8 = (undefined1  [8])Builder::makeLocalSet(&local_48,IVar19,this_00->body);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                     (Expression **)auStack_a8);
          if (uVar38 != TVar31.id) {
            auVar14._8_8_ = 0;
            auVar14._0_8_ = uVar38;
            IVar19 = Builder::addVar((Builder *)
                                     ((builder.wasm)->debugInfoFileNames).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                                     (Name)(auVar14 << 0x40),type_00);
            iVar20 = ExpressionManipulator::copy
                               ((EVP_PKEY_CTX *)this_00->body,
                                (EVP_PKEY_CTX *)
                                ((builder.wasm)->debugInfoFileNames).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            auStack_a8 = (undefined1  [8])
                         Builder::makeLocalSet
                                   (&local_48,IVar19,(Expression *)CONCAT44(extraout_var,iVar20));
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_a8);
          }
          if ((this_00->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
              != (Name *)0x0) {
            auStack_a8 = (undefined1  [8])this_00;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_a8);
            uVar39 = (this_00->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.
                     type.id;
            if (uVar39 < 2) {
              if (uVar39 != 1) {
                __assert_fail("br->type == Type::unreachable",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                              ,0x128,"void wasm::Flatten::visitExpression(Expression *)");
              }
              pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x10,8);
              pEVar26->_id = UnreachableId;
              (pEVar26->type).id = 1;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)local_50,pEVar26);
            }
            else {
              pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
              pEVar26->_id = LocalGetId;
              pEVar26[1]._id = IVar19;
              (pEVar26->type).id = uVar38;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)local_50,pEVar26);
            }
            ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                                 ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features
                                 );
            *ppEVar27 = pEVar26;
          }
          this_00->body = (Expression *)0x0;
          Break::finalize((Break *)this_00);
        }
      }
    }
    else {
      bVar17 = LocalSet::isTee((LocalSet *)local_78);
      if (bVar17) {
        expression = (MixedArena *)(this_00->name).super_IString.str._M_str;
        if (((Type *)&(expression->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->id == 1) {
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)local_50,(Expression *)expression);
          goto LAB_006f81e7;
        }
        LocalSet::makeSet((LocalSet *)this_00);
        auStack_a8 = (undefined1  [8])this_00;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   (Expression **)auStack_a8);
        TVar31 = Function::getLocalType
                           ((Function *)
                            ((builder.wasm)->debugInfoFileNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (Index)(this_00->name).super_IString.str._M_len);
        sVar15 = (this_00->name).super_IString.str._M_len;
        pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        pEVar26->_id = LocalGetId;
        pEVar26[1]._id = (Id)sVar15;
        (pEVar26->type).id = TVar31.id;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,pEVar26);
        ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                             ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features);
        *ppEVar27 = pEVar26;
      }
    }
  }
LAB_006f7c40:
  local_78 = (Try *)*(local_50->
                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     ).
                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     .replacep;
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)auStack_a8,(Expression *)local_78);
  uVar38 = (local_78->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id;
  if (uVar38 != 0) {
    if (uVar38 == 1) {
      if (iStack_60._M_current == local_58) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   iStack_60,(Expression **)&local_78);
      }
      else {
        *iStack_60._M_current = (Expression *)local_78;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x10,8);
      pEVar26->_id = UnreachableId;
      (pEVar26->type).id = 1;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 local_50,pEVar26);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar38;
      IVar19 = Builder::addVar((Builder *)
                               ((builder.wasm)->debugInfoFileNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(Function *)0x0,
                               (Name)(auVar12 << 0x40),type_00);
      auStack_a8 = (undefined1  [8])Builder::makeLocalSet(&local_48,IVar19,(Expression *)local_78);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                 (Expression **)auStack_a8);
      pEVar26 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar26->_id = LocalGetId;
      pEVar26[1]._id = IVar19;
      (pEVar26->type).id = uVar38;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 local_50,pEVar26);
    }
    ppEVar27 = SmallVector<wasm::Expression_*,_10UL>::back
                         ((SmallVector<wasm::Expression_*,_10UL> *)&(builder.wasm)->features);
    *ppEVar27 = pEVar26;
  }
  if (prelude_1 != (Expression *)iStack_60._M_current) {
    auStack_a8 = (undefined1  [8])
                 ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                 ::getParent(local_50);
    if ((auStack_a8 == (undefined1  [8])0x0) ||
       ((uVar38 = (ulong)(((SpecificExpression<(wasm::Expression::Id)9> *)
                          &((Try *)auStack_a8)->super_SpecificExpression<(wasm::Expression::Id)49>)
                         ->super_Expression)._id, uVar38 < 0x32 &&
        ((0x200000000000eU >> (uVar38 & 0x3f) & 1) != 0)))) {
      curr_local = *(Expression **)
                    &((((builder.wasm)->globals).
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
      pmVar28 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&((builder.wasm)->allocator).threadId,&curr_local);
      ppEVar7 = (pmVar28->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      pEVar26 = (Expression *)
                (pmVar28->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pEVar6 = (Expression *)
               (pmVar28->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (pmVar28->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_start = (pointer)prelude_1;
      (pmVar28->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_finish = iStack_60._M_current;
      (pmVar28->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_58;
      prelude_1 = pEVar26;
      iStack_60._M_current = (Expression **)pEVar6;
      local_58 = ppEVar7;
    }
    else {
      this_01 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&((builder.wasm)->allocator).threadId,(key_type *)auStack_a8);
      iVar16._M_current = iStack_60._M_current;
      if (prelude_1 != (Expression *)iStack_60._M_current) {
        pEVar26 = prelude_1;
        do {
          curr_local = *(Expression **)pEVar26;
          __position._M_current = *(Expression ***)(this_01 + 8);
          if (__position._M_current == *(Expression ***)(this_01 + 0x10)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>(this_01,__position,&curr_local);
          }
          else {
            *__position._M_current = curr_local;
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
          }
          pEVar26 = (Expression *)&pEVar26->type;
        } while (pEVar26 != (Expression *)iVar16._M_current);
      }
    }
  }
LAB_006f7dc7:
  if (prelude_1 != (Expression *)0x0) {
    operator_delete(prelude_1,(long)local_58 - (long)prelude_1);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->type;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse && iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          // the whole if (+any preludes from the condition) is now a prelude
          prelude = rep;
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }